

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_encoder.c
# Opt level: O1

lzma_ret lzma_index_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_index *i)

{
  undefined4 *puVar1;
  lzma_ret lVar2;
  void *pvVar3;
  
  if ((code *)next->init != lzma_index_encoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)lzma_index_encoder_init;
  if (i == (lzma_index *)0x0) {
    lVar2 = LZMA_PROG_ERROR;
  }
  else {
    if (next->coder == (void *)0x0) {
      pvVar3 = lzma_alloc(0x150,allocator);
      next->coder = pvVar3;
      if (pvVar3 == (void *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = index_encode;
      next->end = index_encoder_end;
    }
    puVar1 = (undefined4 *)next->coder;
    lzma_index_iter_init((lzma_index_iter *)(puVar1 + 4),i);
    lVar2 = LZMA_OK;
    *puVar1 = 0;
    *(lzma_index **)(puVar1 + 2) = i;
    *(undefined8 *)(puVar1 + 0x50) = 0;
    puVar1[0x52] = 0;
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_index_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_index *i)
{
	lzma_next_coder_init(&lzma_index_encoder_init, next, allocator);

	if (i == NULL)
		return LZMA_PROG_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_index_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &index_encode;
		next->end = &index_encoder_end;
	}

	index_encoder_reset(next->coder, i);

	return LZMA_OK;
}